

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

uint32_t binary_fuse16_hash(uint64_t index,uint64_t hash,binary_fuse16_t *filter)

{
  undefined1 auVar1 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = hash;
  return (uint)((hash & 0xfffffffff) >> ((char)index * -0x12 + 0x24U & 0x3f)) &
         filter->SegmentLengthMask ^
         SUB164(ZEXT416(filter->SegmentCountLength) * auVar1,8) + (int)index * filter->SegmentLength
  ;
}

Assistant:

static inline uint32_t binary_fuse16_hash(uint64_t index, uint64_t hash,
                                        const binary_fuse16_t *filter) {
    uint64_t h = binary_fuse_mulhi(hash, filter->SegmentCountLength);
    h += index * filter->SegmentLength;
    // keep the lower 36 bits
    uint64_t hh = hash & ((1ULL << 36U) - 1);
    // index 0: right shift by 36; index 1: right shift by 18; index 2: no shift
    h ^= (size_t)((hh >> (36 - 18 * index)) & filter->SegmentLengthMask);
    return (uint32_t)h;
}